

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void end_examples<sparse_parameters>(lda *l,sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  float *pfVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  float fVar5;
  
  for (p_Var1 = (weights->_map)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    pfVar2 = (l->decay_levels)._end;
    fVar5 = expf(pfVar2[-1] -
                 pfVar2[(int)((double)*(float *)((long)&(p_Var1[2]._M_nxt)->_M_nxt +
                                                (ulong)l->all->lda * 4) + (-1.0 - l->example_t))]);
    if (1.0 <= fVar5) {
      fVar5 = 1.0;
    }
    if (l->all->lda != 0) {
      p_Var3 = p_Var1[2]._M_nxt;
      uVar4 = 0;
      do {
        *(float *)((long)&p_Var3->_M_nxt + uVar4 * 4) =
             *(float *)((long)&p_Var3->_M_nxt + uVar4 * 4) * fVar5;
        uVar4 = uVar4 + 1;
      } while (uVar4 < l->all->lda);
    }
  }
  return;
}

Assistant:

void end_examples(lda &l, T &weights)
{
  for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
  {
    float decay_component =
        l.decay_levels.last() - l.decay_levels.end()[(int)(-1 - l.example_t + (&(*iter))[l.all->lda])];
    float decay = fmin(1.f, correctedExp(decay_component));

    weight *wp = &(*iter);
    for (size_t i = 0; i < l.all->lda; ++i) wp[i] *= decay;
  }
}